

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O1

void __thiscall
PSVIWriterHandlers::processTypeDefinitionRef
          (PSVIWriterHandlers *this,XMLCh *enclose,XSTypeDefinition *type)

{
  XMLCh *elementName;
  
  if (type != (XSTypeDefinition *)0x0) {
    writeOpen(this,enclose);
    incIndent(this);
    if (*(int *)(type + 0x28) == 0x10) {
      elementName = (XMLCh *)&xercesc_4_0::PSVIUni::fgSimpleTypeDefinition;
    }
    else {
      elementName = (XMLCh *)&xercesc_4_0::PSVIUni::fgComplexTypeDefinition;
    }
    sendReference(this,elementName,(XSObject *)type);
    sendUnindentedElement(this,enclose);
    return;
  }
  sendElementEmpty(this,enclose);
  return;
}

Assistant:

void PSVIWriterHandlers::processTypeDefinitionRef(const XMLCh* enclose, XSTypeDefinition* type) {
	if (type==NULL) {
		sendElementEmpty(enclose);
	} else {
		sendIndentedElement(enclose);
		if (type->getTypeCategory() == XSTypeDefinition::SIMPLE_TYPE) {
			sendReference(PSVIUni::fgSimpleTypeDefinition, type);
		} else {
			sendReference(PSVIUni::fgComplexTypeDefinition, type);
		}
		sendUnindentedElement(enclose);
	}
}